

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O3

void proxy_conn_free(proxy_conn_handle *pc)

{
  void *pvVar1;
  
  pvVar1 = pc->priv;
  if (pvVar1 != (void *)0x0) {
    proxy_conn_stop(pc);
    worker_free((worker_handle *)((long)pvVar1 + 0xb8));
    worker_free((worker_handle *)((long)pvVar1 + 0x98));
    worker_free((worker_handle *)((long)pvVar1 + 0x78));
    mutex_free((mutex_handle *)((long)pvVar1 + 0x68));
    mutex_free((mutex_handle *)((long)pvVar1 + 0x70));
    conn_free((conn_handle *)((long)pvVar1 + 0x48));
    conn_free((conn_handle *)((long)pvVar1 + 0x28));
    conn_free((conn_handle *)((long)pvVar1 + 8));
    free(pc->priv);
    pc->priv = (void *)0x0;
  }
  return;
}

Assistant:

void proxy_conn_free(struct proxy_conn_handle *pc)
{
	if (pc->priv != NULL) {
		struct proxy_conn_priv *priv = pc->priv;

		proxy_conn_stop(pc);

		worker_free(&priv->worker_tcp);
		worker_free(&priv->worker_data);
		worker_free(&priv->worker_control);

		mutex_free(&priv->mutex_client);
		mutex_free(&priv->mutex_client_send);

		conn_free(&priv->conn_tcp);
		conn_free(&priv->conn_data);
		conn_free(&priv->conn_control);

		free(pc->priv);
		pc->priv = NULL;
	}
}